

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QtPrivate::QCalendarView::wheelEvent(QCalendarView *this,QWheelEvent *event)

{
  QCalendarModel *this_00;
  int iVar1;
  long in_FS_OFFSET;
  qint64 local_60;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  qint64 local_40;
  void *local_38;
  undefined8 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)((ulong)((long)*(int *)(event + 0x5c) * 0x77777777) >> 0x20) - *(int *)(event + 0x5c)
  ;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
  this_00 = (QCalendarModel *)QAbstractItemView::model((QAbstractItemView *)this);
  local_60 = (qint64)QCalendarModel::dateForCell(this_00,(int)local_58,local_58._4_4_);
  local_60 = QDate::addMonths(&local_60,(iVar1 >> 6) - (iVar1 >> 0x1f),
                              *(undefined8 *)&this_00->m_calendar);
  local_30 = &local_40;
  local_38 = (void *)0x0;
  local_40 = local_60;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarView::wheelEvent(QWheelEvent *event)
{
    const int numDegrees = event->angleDelta().y() / 8;
    const int numSteps = numDegrees / 15;
    const QModelIndex index = currentIndex();
    QCalendarModel *calendarModel = static_cast<QCalendarModel*>(model());
    QDate currentDate = calendarModel->dateForCell(index.row(), index.column());
    currentDate = currentDate.addMonths(-numSteps, calendarModel->calendar());
    emit showDate(currentDate);
}